

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_new_points.cpp
# Opt level: O0

void new_points_calc_all(Am_Object *inter,Am_Object *ref_obj,bool first_point,int x,int y,
                        bool *abort,Am_Inter_Location *data)

{
  byte bVar1;
  Am_Object *this;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *value;
  Am_Object local_68 [3];
  Am_Object local_50;
  Am_Object init_ref_obj;
  int local_40;
  int d;
  int c;
  int b;
  int a;
  bool as_line;
  bool *abort_local;
  int local_20;
  int y_local;
  int x_local;
  bool first_point_local;
  Am_Object *ref_obj_local;
  Am_Object *inter_local;
  
  _a = abort;
  abort_local._4_4_ = y;
  local_20 = x;
  y_local._3_1_ = first_point;
  _x_local = ref_obj;
  ref_obj_local = inter;
  pAVar3 = Am_Object::Get(inter,0xdb,0);
  b._3_1_ = Am_Value::operator_cast_to_bool(pAVar3);
  this = ref_obj_local;
  if ((y_local._3_1_ & 1) == 0) {
    pAVar3 = Am_Object::Get(ref_obj_local,0x12e,0);
    Am_Object::Am_Object(&local_50,pAVar3);
    bVar2 = Am_Object::operator!=(&local_50,_x_local);
    if (bVar2) {
      Am_Translate_Coordinates
                (_x_local,local_20,abort_local._4_4_,&local_50,&local_20,
                 (int *)((long)&abort_local + 4));
      Am_Object::operator=(_x_local,&local_50);
    }
    Am_Object::~Am_Object(&local_50);
  }
  else {
    value = Am_Object::operator_cast_to_Am_Wrapper_(_x_local);
    Am_Object::Set(this,0x12e,value,0);
  }
  if ((b._3_1_ & 1) == 0) {
    calc_rect_two_points
              (ref_obj_local,(bool)(y_local._3_1_ & 1),local_20,abort_local._4_4_,_a,&c,&d,&local_40
               ,(int *)((long)&init_ref_obj.data + 4));
  }
  else {
    calc_line_two_points
              (ref_obj_local,(bool)(y_local._3_1_ & 1),local_20,abort_local._4_4_,_a,&c,&d,&local_40
               ,(int *)((long)&init_ref_obj.data + 4));
  }
  bVar1 = b._3_1_;
  Am_Object::Am_Object(local_68,_x_local);
  Am_Inter_Location::Set_Location
            (data,(bool)(bVar1 & 1),local_68,c,d,local_40,init_ref_obj.data._4_4_,false);
  Am_Object::~Am_Object(local_68);
  if ((y_local._3_1_ & 1) != 0) {
    Am_Inter_Location::Set_Growing(data,false,true);
  }
  return;
}

Assistant:

void
new_points_calc_all(Am_Object &inter, Am_Object &ref_obj, bool first_point,
                    int x, int y, bool &abort, Am_Inter_Location &data)
{
  bool as_line = inter.Get(Am_AS_LINE);
  int a, b, c, d;
  if (first_point)
    inter.Set(Am_INITIAL_REF_OBJECT, ref_obj);
  else {
    Am_Object init_ref_obj = inter.Get(Am_INITIAL_REF_OBJECT);
    if (init_ref_obj != ref_obj) {
      Am_Translate_Coordinates(ref_obj, x, y, init_ref_obj, x, y);
      ref_obj = init_ref_obj;
    }
  }

  if (as_line)
    calc_line_two_points(inter, first_point, x, y, abort, a, b, c, d);
  else
    calc_rect_two_points(inter, first_point, x, y, abort, a, b, c, d);
  data.Set_Location(as_line, ref_obj, a, b, c, d, false);
  if (first_point)
    data.Set_Growing(false);
}